

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

TimingControl * __thiscall
slang::ast::PrimitiveInstanceSymbol::getDelay(PrimitiveInstanceSymbol *this)

{
  SyntaxNode *this_00;
  bool bVar1;
  int iVar2;
  Scope *__u;
  HierarchyInstantiationSyntax *pHVar3;
  TimingControl **ppTVar4;
  Delay3Control *pDVar5;
  PrimitiveInstantiationSyntax *pPVar6;
  undefined4 extraout_var;
  socklen_t __len;
  ParameterValueAssignmentSyntax *in_RDI;
  LookupLocation LVar7;
  TimingControlSyntax *delaySyntax;
  Expression *d3;
  ParameterValueAssignmentSyntax *params;
  SyntaxNode *parent;
  ASTContext context;
  SyntaxNode *syntax;
  Scope *scope;
  void **in_stack_ffffffffffffff18;
  ASTContext *in_stack_ffffffffffffff28;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff30;
  Scope *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  bitmask<slang::ast::ASTFlags> local_88;
  Scope *local_80;
  uint32_t local_78;
  Scope *local_70;
  uint32_t local_68;
  sockaddr local_60 [3];
  undefined8 local_28;
  SyntaxNode *local_20;
  Scope *this_01;
  ParameterValueAssignmentSyntax *exprs;
  Compilation *in_stack_fffffffffffffff8;
  TimingControl *pTVar8;
  
  exprs = in_RDI;
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<const_slang::ast::TimingControl_*> *)0x42b665);
  if (bVar1) {
    ppTVar4 = std::optional<const_slang::ast::TimingControl_*>::operator*
                        ((optional<const_slang::ast::TimingControl_*> *)0x42b679);
    pTVar8 = *ppTVar4;
  }
  else {
    __u = Symbol::getParentScope((Symbol *)in_RDI);
    local_20 = Symbol::getSyntax((Symbol *)in_RDI);
    if (((__u == (Scope *)0x0) || (local_20 == (SyntaxNode *)0x0)) ||
       (local_20->parent == (SyntaxNode *)0x0)) {
      local_28 = 0;
      std::optional<slang::ast::TimingControl_const*>::operator=
                ((optional<const_slang::ast::TimingControl_*> *)in_RDI,in_stack_ffffffffffffff18);
      pTVar8 = (TimingControl *)0x0;
    }
    else {
      this_01 = __u;
      LVar7 = LookupLocation::before((Symbol *)in_RDI);
      local_80 = LVar7.scope;
      local_78 = LVar7.index;
      local_70 = local_80;
      local_68 = local_78;
      bitmask<slang::ast::ASTFlags>::bitmask(&local_88,NonProcedural);
      LVar7._8_8_ = in_stack_ffffffffffffff40;
      LVar7.scope = in_stack_ffffffffffffff38;
      ASTContext::ASTContext
                (in_stack_ffffffffffffff28,(Scope *)in_RDI,LVar7,in_stack_ffffffffffffff30);
      this_00 = local_20->parent;
      if (this_00->kind == HierarchyInstantiation) {
        pHVar3 = slang::syntax::SyntaxNode::as<slang::syntax::HierarchyInstantiationSyntax>(this_00)
        ;
        if (pHVar3->parameters != (ParameterValueAssignmentSyntax *)0x0) {
          Scope::getCompilation(this_01);
          Delay3Control::fromParams(in_stack_fffffffffffffff8,exprs,(ASTContext *)this_01);
          std::optional<slang::ast::TimingControl_const*>::operator=
                    ((optional<const_slang::ast::TimingControl_*> *)in_stack_ffffffffffffff30.m_bits
                     ,(TimingControl **)in_stack_ffffffffffffff28);
          ppTVar4 = std::optional<const_slang::ast::TimingControl_*>::value
                              ((optional<const_slang::ast::TimingControl_*> *)in_RDI);
          if ((*ppTVar4)->kind == Delay3) {
            ppTVar4 = std::optional<const_slang::ast::TimingControl_*>::value
                                ((optional<const_slang::ast::TimingControl_*> *)in_RDI);
            pDVar5 = TimingControl::as<slang::ast::Delay3Control>(*ppTVar4);
            if (pDVar5->expr3 != (Expression *)0x0) {
              ASTContext::addDiag((ASTContext *)in_stack_ffffffffffffff38,(DiagCode)0x1d0005,
                                  pDVar5->expr3->sourceRange);
            }
          }
          ppTVar4 = std::optional<const_slang::ast::TimingControl_*>::operator*
                              ((optional<const_slang::ast::TimingControl_*> *)0x42b86e);
          return *ppTVar4;
        }
      }
      else {
        pPVar6 = slang::syntax::SyntaxNode::as<slang::syntax::PrimitiveInstantiationSyntax>(this_00)
        ;
        if (pPVar6->delay != (TimingControlSyntax *)0x0) {
          iVar2 = TimingControl::bind((int)pPVar6->delay,local_60,__len);
          std::optional<slang::ast::TimingControl_const*>::operator=
                    ((optional<const_slang::ast::TimingControl_*> *)CONCAT44(extraout_var,iVar2),
                     (TimingControl **)in_stack_ffffffffffffff28);
          ppTVar4 = std::optional<const_slang::ast::TimingControl_*>::operator*
                              ((optional<const_slang::ast::TimingControl_*> *)0x42b8d3);
          return *ppTVar4;
        }
      }
      std::optional<slang::ast::TimingControl_const*>::operator=
                ((optional<const_slang::ast::TimingControl_*> *)in_RDI,&__u->compilation);
      pTVar8 = (TimingControl *)0x0;
    }
  }
  return pTVar8;
}

Assistant:

const TimingControl* PrimitiveInstanceSymbol::getDelay() const {
    if (delay)
        return *delay;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    if (!scope || !syntax || !syntax->parent) {
        delay = nullptr;
        return nullptr;
    }

    ASTContext context(*scope, LookupLocation::before(*this), ASTFlags::NonProcedural);

    auto& parent = *syntax->parent;
    if (parent.kind == SyntaxKind::HierarchyInstantiation) {
        if (auto params = parent.as<HierarchyInstantiationSyntax>().parameters) {
            delay = &Delay3Control::fromParams(scope->getCompilation(), *params, context);
            if (delay.value()->kind == TimingControlKind::Delay3) {
                if (auto d3 = delay.value()->as<Delay3Control>().expr3)
                    context.addDiag(diag::Delay3UdpNotAllowed, d3->sourceRange);
            }
            return *delay;
        }
    }
    else {
        auto delaySyntax = parent.as<PrimitiveInstantiationSyntax>().delay;
        if (delaySyntax) {
            delay = &TimingControl::bind(*delaySyntax, context);
            return *delay;
        }
    }

    delay = nullptr;
    return nullptr;
}